

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

void set_iterate(set s,set_cb_iterate iterate_cb,set_cb_iterate_args args)

{
  bucket pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if ((((s != (set)0x0) && (iterate_cb != (set_cb_iterate)0x0)) && (s->buckets != (bucket)0x0)) &&
     (uVar3 = s->capacity, uVar3 != 0)) {
    uVar5 = 0;
    do {
      if ((s->buckets[uVar5].pairs != (pair)0x0) &&
         (pbVar1 = s->buckets + uVar5, pbVar1->count != 0)) {
        lVar4 = 8;
        uVar3 = 0;
        do {
          iVar2 = (*iterate_cb)(s,*(set_key *)((long)pbVar1->pairs + lVar4 + -8),
                                *(set_value *)((long)&pbVar1->pairs->key + lVar4),args);
          if (iVar2 != 0) {
            return;
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar3 < pbVar1->count);
        uVar3 = s->capacity;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void set_iterate(set s, set_cb_iterate iterate_cb, set_cb_iterate_args args)
{
	if (s != NULL && s->buckets != NULL && iterate_cb != NULL)
	{
		size_t bucket_iterator;

		for (bucket_iterator = 0; bucket_iterator < s->capacity; ++bucket_iterator)
		{
			bucket b = &s->buckets[bucket_iterator];

			if (b->pairs != NULL && b->count > 0)
			{
				size_t pair_iterator;

				for (pair_iterator = 0; pair_iterator < b->count; ++pair_iterator)
				{
					pair p = &b->pairs[pair_iterator];

					if (iterate_cb(s, p->key, p->value, args) != 0)
					{
						return;
					}
				}
			}
		}
	}
}